

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1c1499d::AV1Convolve2DCopyHighbdCompoundTest_RunTest_Test::TestBody
          (AV1Convolve2DCopyHighbdCompoundTest_RunTest_Test *this)

{
  uint uVar1;
  int width;
  int iVar2;
  int iVar3;
  _func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int *p_Var4;
  ParamType *pPVar5;
  uint16_t *src;
  int iVar6;
  CompoundParam *compound;
  undefined1 *puVar7;
  ConvolveParams conv_params_2;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  compound_params;
  uint16_t test [16384];
  CONV_BUF_TYPE reference_conv_buf [16384];
  uint16_t reference [16384];
  ConvolveParams CStack_200c8;
  uint16_t *puStack_20098;
  uint16_t *puStack_20090;
  uint16_t *puStack_20088;
  undefined1 *puStack_20080;
  undefined1 *puStack_20078;
  undefined1 *puStack_20070;
  ConvolveParams aCStack_20060 [682];
  uint16_t auStack_18060 [16384];
  undefined1 auStack_10060 [65584];
  
  GetCompoundParams();
  puStack_20080 = puStack_20070;
  if (puStack_20078 != puStack_20070) {
    puStack_20088 =
         (this->super_AV1Convolve2DCopyHighbdCompoundTest).
         super_AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
         .input16_1_;
    puStack_20090 =
         (this->super_AV1Convolve2DCopyHighbdCompoundTest).
         super_AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
         .input16_2_;
    puVar7 = puStack_20078;
    do {
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      uVar1 = (pPVar5->block_).width_;
      width = (pPVar5->block_).height_;
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      src = AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
            ::RandomInput16((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                             *)this,puStack_20088,pPVar5);
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      puStack_20098 =
           AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
           ::RandomInput16((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                            *)this,puStack_20090,pPVar5);
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      iVar6 = (pPVar5->block_).width_;
      iVar2 = (pPVar5->block_).height_;
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      iVar3 = pPVar5->bd_;
      aCStack_20060[0].round_0 = 3;
      aCStack_20060[0].round_1 = 7;
      if (10 < iVar3) {
        aCStack_20060[0].round_0 = iVar3 + -7;
      }
      aCStack_20060[0].dst = (CONV_BUF_TYPE *)auStack_10060;
      aCStack_20060[0].dst_stride = 0x80;
      aCStack_20060[0].plane = 0;
      aCStack_20060[0].do_average = 0;
      aCStack_20060[0].use_dist_wtd_comp_avg._0_1_ = *puVar7;
      aCStack_20060[0].is_compound = 1;
      aCStack_20060[0].use_dist_wtd_comp_avg._1_3_ = 0;
      aCStack_20060[0]._40_8_ = *(undefined8 *)(puVar7 + 4);
      av1_highbd_dist_wtd_convolve_2d_copy_c
                (src,iVar6,(uint16_t *)(auStack_10060 + 0x8000),0x80,iVar6,iVar2,aCStack_20060,iVar3
                );
      aCStack_20060[0].round_0 = iVar3 + -7;
      if (iVar3 < 0xb) {
        aCStack_20060[0].round_0 = 3;
      }
      aCStack_20060[0].do_average = 1;
      aCStack_20060[0].dst = (CONV_BUF_TYPE *)auStack_10060;
      aCStack_20060[0]._40_8_ = *(undefined8 *)(puVar7 + 4);
      aCStack_20060[0].dst_stride = 0x80;
      aCStack_20060[0].round_1 = 7;
      aCStack_20060[0].plane = 0;
      aCStack_20060[0].use_dist_wtd_comp_avg._0_1_ = *puVar7;
      aCStack_20060[0].is_compound = 1;
      aCStack_20060[0].use_dist_wtd_comp_avg._1_3_ = 0;
      av1_highbd_dist_wtd_convolve_2d_copy_c
                (puStack_20098,iVar6,(uint16_t *)(auStack_10060 + 0x8000),0x80,iVar6,iVar2,
                 aCStack_20060,iVar3);
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      p_Var4 = pPVar5->test_func_;
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      iVar6 = (pPVar5->block_).width_;
      iVar2 = (pPVar5->block_).height_;
      pPVar5 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
               ::GetParam();
      iVar3 = pPVar5->bd_;
      CStack_200c8.round_0 = 3;
      CStack_200c8.round_1 = 7;
      if (10 < iVar3) {
        CStack_200c8.round_0 = iVar3 + -7;
      }
      CStack_200c8.dst = auStack_18060;
      CStack_200c8.dst_stride = 0x80;
      CStack_200c8.plane = 0;
      CStack_200c8.do_average = 0;
      CStack_200c8.use_dist_wtd_comp_avg._0_1_ = *puVar7;
      CStack_200c8.is_compound = 1;
      CStack_200c8.use_dist_wtd_comp_avg._1_3_ = 0;
      CStack_200c8._40_8_ = *(undefined8 *)(puVar7 + 4);
      (*p_Var4)(src,iVar6,(unsigned_short *)aCStack_20060,0x80,iVar6,iVar2,&CStack_200c8,iVar3);
      CStack_200c8.round_0 = iVar3 + -7;
      if (iVar3 < 0xb) {
        CStack_200c8.round_0 = 3;
      }
      CStack_200c8.do_average = 1;
      CStack_200c8.dst = auStack_18060;
      CStack_200c8._40_8_ = *(undefined8 *)(puVar7 + 4);
      CStack_200c8.dst_stride = 0x80;
      CStack_200c8.round_1 = 7;
      CStack_200c8.plane = 0;
      CStack_200c8.use_dist_wtd_comp_avg._0_1_ = *puVar7;
      CStack_200c8.is_compound = 1;
      CStack_200c8.use_dist_wtd_comp_avg._1_3_ = 0;
      (*p_Var4)(puStack_20098,iVar6,(unsigned_short *)aCStack_20060,0x80,iVar6,iVar2,&CStack_200c8,
                iVar3);
      AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
      ::AssertOutputBufferEq
                ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                  *)auStack_10060,auStack_18060,(uint16_t *)(ulong)uVar1,width,iVar6);
      AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
      ::AssertOutputBufferEq
                ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                  *)(auStack_10060 + 0x8000),(uint16_t *)aCStack_20060,(uint16_t *)(ulong)uVar1,
                 width,iVar6);
      puVar7 = puVar7 + 0xc;
    } while (puVar7 != puStack_20080);
  }
  if (puStack_20078 != (undefined1 *)0x0) {
    operator_delete(puStack_20078);
  }
  return;
}

Assistant:

TEST_P(AV1Convolve2DCopyHighbdCompoundTest, RunTest) { RunTest(); }